

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_word.c
# Opt level: O2

ulong BN_div_word(BIGNUM *a,ulong w)

{
  ulong l;
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong d;
  
  uVar3 = 0xffffffffffffffff;
  if (w != 0) {
    if (a->top == 0) {
      uVar3 = 0;
    }
    else {
      iVar1 = BN_num_bits_word(w);
      d = w << (-(char)iVar1 & 0x3fU);
      iVar2 = BN_lshift(a,a,0x40 - iVar1);
      if (iVar2 != 0) {
        uVar3 = 0;
        for (uVar4 = (ulong)(uint)a->top; 0 < (int)uVar4; uVar4 = uVar4 - 1) {
          l = a->d[uVar4 - 1];
          uVar3 = bn_div_words(uVar3,l,d);
          a->d[uVar4 - 1] = uVar3;
          uVar3 = l - uVar3 * d;
        }
        iVar2 = a->top;
        if ((0 < (long)iVar2) && (a->d[(long)iVar2 + -1] == 0)) {
          a->top = iVar2 + -1;
        }
        uVar3 = uVar3 >> ((byte)(0x40 - iVar1) & 0x3f);
      }
    }
  }
  return uVar3;
}

Assistant:

BN_ULONG BN_div_word(BIGNUM *a, BN_ULONG w)
{
    BN_ULONG ret = 0;
    int i, j;

    bn_check_top(a);
    w &= BN_MASK2;

    if (!w)
        /* actually this an error (division by zero) */
        return (BN_ULONG)-1;
    if (a->top == 0)
        return 0;

    /* normalize input (so bn_div_words doesn't complain) */
    j = BN_BITS2 - BN_num_bits_word(w);
    w <<= j;
    if (!BN_lshift(a, a, j))
        return (BN_ULONG)-1;

    for (i = a->top - 1; i >= 0; i--) {
        BN_ULONG l, d;

        l = a->d[i];
        d = bn_div_words(ret, l, w);
        ret = (l - ((d * w) & BN_MASK2)) & BN_MASK2;
        a->d[i] = d;
    }
    if ((a->top > 0) && (a->d[a->top - 1] == 0))
        a->top--;
    ret >>= j;
    bn_check_top(a);
    return (ret);
}